

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O3

qint64 __thiscall QRingBuffer::indexOf(QRingBuffer *this,char c,qint64 maxLength,qint64 pos)

{
  long lVar1;
  QRingChunk *pQVar2;
  long lVar3;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  QRingChunk *pQVar7;
  long lVar8;
  qint64 qVar9;
  
  if ((maxLength != 0) && (lVar3 = (this->buffers).d.size, lVar3 != 0)) {
    pQVar7 = (this->buffers).d.ptr;
    pQVar2 = pQVar7 + lVar3;
    lVar3 = -pos;
    do {
      lVar1 = pQVar7->headOffset;
      lVar6 = (pQVar7->tailOffset - lVar1) + lVar3;
      qVar9 = maxLength;
      if (lVar6 < maxLength) {
        qVar9 = lVar6;
      }
      if (0 < qVar9) {
        pcVar5 = (pQVar7->chunk).d.ptr;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = "";
        }
        lVar8 = 0;
        if (0 < lVar3) {
          lVar8 = lVar3;
        }
        pvVar4 = memchr(pcVar5 + lVar1 + (lVar3 >> 0x3f & -lVar3),(int)c,qVar9 - lVar8);
        if (pvVar4 != (void *)0x0) {
          return (long)pvVar4 + ((lVar8 + pos) - (long)(pcVar5 + lVar1 + (lVar3 >> 0x3f & -lVar3)));
        }
        if (maxLength <= lVar6) {
          return -1;
        }
      }
      pQVar7 = pQVar7 + 1;
      lVar3 = qVar9;
    } while (pQVar7 != pQVar2);
  }
  return -1;
}

Assistant:

qint64 QRingBuffer::indexOf(char c, qint64 maxLength, qint64 pos) const
{
    Q_ASSERT(maxLength >= 0 && pos >= 0);

    if (maxLength == 0)
        return -1;

    qint64 index = -pos;
    for (const QRingChunk &chunk : buffers) {
        const qint64 nextBlockIndex = qMin(index + chunk.size(), maxLength);

        if (nextBlockIndex > 0) {
            const char *ptr = chunk.data();
            if (index < 0) {
                ptr -= index;
                index = 0;
            }

            const char *findPtr = reinterpret_cast<const char *>(memchr(ptr, c,
                                                                        nextBlockIndex - index));
            if (findPtr)
                return qint64(findPtr - ptr) + index + pos;

            if (nextBlockIndex == maxLength)
                return -1;
        }
        index = nextBlockIndex;
    }
    return -1;
}